

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O3

StringPtr * __thiscall
kj::Table<unsigned_int,_kj::TreeIndex<kj::_::(anonymous_namespace)::UintCompare>_>::insert
          (Table<unsigned_int,_kj::TreeIndex<kj::_::(anonymous_namespace)::UintCompare>_> *this,
          StringPtr *row)

{
  undefined4 *puVar1;
  size_t newSize;
  Impl<0UL,_false> local_28 [16];
  
  Impl<0UL,_false>::insert
            (local_28,(Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_>
                       *)this,*(long *)(this + 8) - *(long *)this >> 2,row,0xffffffff);
  if (local_28[0] != (Impl<0UL,_false>)0x1) {
    puVar1 = *(undefined4 **)(this + 8);
    if (puVar1 == *(undefined4 **)(this + 0x10)) {
      newSize = 4;
      if (puVar1 != *(undefined4 **)this) {
        newSize = (long)puVar1 - (long)*(undefined4 **)this >> 1;
      }
      Vector<unsigned_int>::setCapacity((Vector<unsigned_int> *)this,newSize);
      puVar1 = *(undefined4 **)(this + 8);
    }
    *puVar1 = *(undefined4 *)&(row->content).ptr;
    *(StringPtr **)(this + 8) = (StringPtr *)(puVar1 + 1);
    return (StringPtr *)(puVar1 + 1);
  }
  _::throwDuplicateTableRow();
}

Assistant:

Row& Table<Row, Indexes...>::insert(Row&& row) {
  if (kj::none != Impl<>::insert(*this, rows.size(), row, kj::maxValue)) {
    _::throwDuplicateTableRow();
  } else {
    return rows.add(kj::mv(row));
  }
}